

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

void __thiscall kratos::StatementGraph::add_stmt_child(StatementGraph *this,Stmt *stmt)

{
  allocator<kratos::IRNode_*> *this_00;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  bool bVar1;
  int iVar2;
  IRNodeKind IVar3;
  undefined4 extraout_var;
  StmtException *pSVar4;
  pair<std::__detail::_Node_iterator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false,_false>,_bool>
  pVar5;
  Stmt *local_1b8;
  mapped_type *local_190;
  mapped_type *node;
  undefined1 local_180;
  undefined1 local_178 [8];
  StmtNode node_value;
  IRNode *local_130;
  Stmt *local_128;
  iterator local_120;
  size_type local_118;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_110;
  allocator<char> local_f1;
  string local_f0;
  _Node_iterator_base<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false> local_d0;
  _Node_iterator_base<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false> local_c8;
  undefined1 local_ba;
  allocator<kratos::IRNode_*> local_b9;
  IRNode *local_b8;
  iterator local_b0;
  size_type local_a8;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_a0;
  allocator<char> local_71;
  string local_70;
  Stmt *local_50;
  Stmt *s;
  IRNode *ir_node;
  uint64_t i;
  _Node_iterator_base<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false> local_30;
  mapped_type *local_28;
  StmtNode *parent_node;
  uint64_t child_count;
  Stmt *stmt_local;
  StatementGraph *this_local;
  
  child_count = (uint64_t)stmt;
  stmt_local = (Stmt *)this;
  iVar2 = (*(stmt->super_IRNode)._vptr_IRNode[1])();
  parent_node = (StmtNode *)CONCAT44(extraout_var,iVar2);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
       ::find(&this->nodes_,(key_type *)&child_count);
  i = (uint64_t)
      std::
      unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
      ::end(&this->nodes_);
  bVar1 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false> *
                     )&i);
  if (bVar1) {
    local_28 = (mapped_type *)0x0;
  }
  else {
    local_28 = std::
               unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
               ::at(&this->nodes_,(key_type *)&child_count);
  }
  ir_node = (IRNode *)0x0;
  do {
    if (parent_node <= ir_node) {
      return;
    }
    s = (Stmt *)(**(code **)(*(long *)child_count + 0x10))(child_count,ir_node);
    IVar3 = IRNode::ir_node_kind((IRNode *)s);
    if (IVar3 == StmtKind) {
      if (s == (Stmt *)0x0) {
        local_1b8 = (Stmt *)0x0;
      }
      else {
        local_1b8 = (Stmt *)__dynamic_cast(s,&IRNode::typeinfo,&Stmt::typeinfo,0);
      }
      local_50 = local_1b8;
      if (local_1b8 == (Stmt *)0x0) {
        local_ba = 1;
        pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"Non statement in statement block",&local_71);
        local_b8 = (IRNode *)child_count;
        local_b0 = &local_b8;
        local_a8 = 1;
        std::allocator<kratos::IRNode_*>::allocator(&local_b9);
        __l_00._M_len = local_a8;
        __l_00._M_array = local_b0;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_a0,__l_00,&local_b9);
        StmtException::StmtException(pSVar4,&local_70,&local_a0);
        local_ba = 0;
        __cxa_throw(pSVar4,&StmtException::typeinfo,StmtException::~StmtException);
      }
      local_c8._M_cur =
           (__node_type *)
           std::
           unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
           ::find(&this->nodes_,&local_50);
      local_d0._M_cur =
           (__node_type *)
           std::
           unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
           ::end(&this->nodes_);
      bVar1 = std::__detail::operator!=(&local_c8,&local_d0);
      if (bVar1) {
        node_value.children._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
        pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"Duplicated statement detected",&local_f1);
        local_130 = (IRNode *)child_count;
        local_128 = local_50;
        local_120 = &local_130;
        local_118 = 2;
        this_00 = (allocator<kratos::IRNode_*> *)
                  ((long)&node_value.children._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
        std::allocator<kratos::IRNode_*>::allocator(this_00);
        __l._M_len = local_118;
        __l._M_array = local_120;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_110,__l,this_00);
        StmtException::StmtException(pSVar4,&local_f0,&local_110);
        node_value.children._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
        __cxa_throw(pSVar4,&StmtException::typeinfo,StmtException::~StmtException);
      }
      local_178 = (undefined1  [8])local_28;
      node_value.parent = (StmtNode *)local_50;
      node_value.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      node_value.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      node_value.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      node_value.children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      node_value.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      node_value.stmt = (Stmt *)0x0;
      node_value.children._M_t._M_impl._0_8_ = 0;
      std::
      set<kratos::StmtNode_*,_std::less<kratos::StmtNode_*>,_std::allocator<kratos::StmtNode_*>_>::
      set((set<kratos::StmtNode_*,_std::less<kratos::StmtNode_*>,_std::allocator<kratos::StmtNode_*>_>
           *)&node_value.stmt);
      pVar5 = std::
              unordered_map<kratos::Stmt*,kratos::StmtNode,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<std::pair<kratos::Stmt*const,kratos::StmtNode>>>
              ::emplace<kratos::Stmt*&,kratos::StmtNode&>
                        ((unordered_map<kratos::Stmt*,kratos::StmtNode,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<std::pair<kratos::Stmt*const,kratos::StmtNode>>>
                          *)this,&local_50,(StmtNode *)local_178);
      node = (mapped_type *)
             pVar5.first.
             super__Node_iterator_base<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false>.
             _M_cur;
      local_180 = pVar5.second;
      local_190 = std::
                  unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
                  ::at(&this->nodes_,&local_50);
      if (local_28 != (mapped_type *)0x0) {
        std::set<kratos::StmtNode*,std::less<kratos::StmtNode*>,std::allocator<kratos::StmtNode*>>::
        emplace<kratos::StmtNode*&>
                  ((set<kratos::StmtNode*,std::less<kratos::StmtNode*>,std::allocator<kratos::StmtNode*>>
                    *)&local_28->children,&local_190);
      }
      add_stmt_child(this,local_50);
      StmtNode::~StmtNode((StmtNode *)local_178);
    }
    ir_node = (IRNode *)((long)&ir_node->_vptr_IRNode + 1);
  } while( true );
}

Assistant:

void StatementGraph::add_stmt_child(Stmt *stmt) {
    auto child_count = stmt->child_count();
    StmtNode *parent_node;
    if (nodes_.find(stmt) == nodes_.end())
        parent_node = nullptr;
    else
        parent_node = &nodes_.at(stmt);
    for (uint64_t i = 0; i < child_count; i++) {
        auto *ir_node = stmt->get_child(i);
        if (ir_node->ir_node_kind() != IRNodeKind::StmtKind) continue;
        auto *s = dynamic_cast<Stmt *>(ir_node);
        if (!s) throw StmtException("Non statement in statement block", {stmt});
        if (nodes_.find(s) != nodes_.end())
            throw StmtException("Duplicated statement detected", {stmt, s});
        StmtNode node_value{parent_node, s, {}};
        nodes_.emplace(s, node_value);
        auto *node = &nodes_.at(s);
        if (parent_node) parent_node->children.emplace(node);
        add_stmt_child(s);
    }
}